

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void n_array_suite::n_array_incomplete_invalid_value(void)

{
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [3];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x585b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)((long)&reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x264,"void n_array_suite::n_array_incomplete_invalid_value()",local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_18c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_190 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x266,"void n_array_suite::n_array_incomplete_invalid_value()",local_18c,&local_190);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void n_array_incomplete_invalid_value()
{
    const char input[] = "[X";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}